

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PNG_Image.cxx
# Opt level: O2

void __thiscall
Fl_PNG_Image::load_png_(Fl_PNG_Image *this,char *name_png,uchar *buffer_png,int maxsize)

{
  uint uVar1;
  uchar *puVar2;
  char cVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  FILE *__stream;
  __jmp_buf_tag *p_Var7;
  uchar *puVar8;
  void *pvVar9;
  Fl_Shared_Image *this_00;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  int iVar13;
  char *pcVar14;
  uint uVar15;
  bool bVar16;
  png_structp pp;
  long local_70;
  FILE *local_68;
  char *local_60;
  uchar *local_58;
  int num_trans;
  fl_png_memory png_mem_data;
  
  if (buffer_png == (uchar *)0x0) {
    __stream = (FILE *)fl_fopen(name_png,"rb");
    if (__stream == (FILE *)0x0) {
      (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -2;
      return;
    }
  }
  else {
    __stream = (FILE *)0x0;
  }
  pcVar14 = "In-memory PNG data";
  if (name_png != (char *)0x0) {
    pcVar14 = name_png;
  }
  pp = (png_structp)png_create_read_struct("1.6.37",0,0);
  if (pp != (png_structp)0x0) {
    local_70 = png_create_info_struct(pp);
    if (pp != (png_structp)0x0 && local_70 != 0) {
      p_Var7 = (__jmp_buf_tag *)png_set_longjmp_fn(pp,longjmp,200);
      iVar6 = _setjmp(p_Var7);
      if (iVar6 == 0) {
        if (buffer_png == (uchar *)0x0) {
          png_init_io(pp,__stream);
        }
        else {
          png_mem_data.last = buffer_png + maxsize;
          png_mem_data.pp = pp;
          png_mem_data.current = buffer_png;
          png_set_read_fn(pp,&png_mem_data,png_read_data_from_mem);
        }
        png_read_info(pp,local_70);
        cVar3 = png_get_color_type(pp,local_70);
        if (cVar3 == '\x03') {
          png_set_expand(pp);
        }
        bVar4 = png_get_color_type(pp,local_70);
        num_trans = 0;
        png_get_tRNS(pp,local_70,0,&num_trans,0);
        bVar5 = png_get_color_type(pp,local_70);
        bVar16 = num_trans != 0;
        iVar6 = png_get_image_width(pp,local_70);
        (this->super_Fl_RGB_Image).super_Fl_Image.w_ = iVar6;
        iVar6 = png_get_image_height(pp,local_70);
        (this->super_Fl_RGB_Image).super_Fl_Image.h_ = iVar6;
        (this->super_Fl_RGB_Image).super_Fl_Image.d_ =
             (byte)(bVar16 | (bVar5 & 4) >> 2 | bVar4 & 2) + 1;
        bVar4 = png_get_bit_depth(pp,local_70);
        if (bVar4 < 8) {
          png_set_packing();
          png_set_expand(pp);
        }
        else {
          cVar3 = png_get_bit_depth(pp,local_70);
          if (cVar3 == '\x10') {
            png_set_strip_16(pp);
          }
        }
        iVar6 = png_get_valid(pp,local_70,0x10);
        if (iVar6 != 0) {
          png_set_tRNS_to_alpha(pp);
        }
        iVar6 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
        uVar1 = (this->super_Fl_RGB_Image).super_Fl_Image.h_;
        iVar13 = (this->super_Fl_RGB_Image).super_Fl_Image.d_;
        uVar11 = (long)(int)uVar1 * (long)iVar6 * (long)iVar13;
        local_68 = __stream;
        local_60 = name_png;
        local_58 = buffer_png;
        if (Fl_RGB_Image::max_size_ <= uVar11 && uVar11 - Fl_RGB_Image::max_size_ != 0) {
          p_Var7 = (__jmp_buf_tag *)png_set_longjmp_fn(pp,longjmp,200);
          longjmp(p_Var7,1);
        }
        iVar13 = iVar13 * iVar6;
        puVar8 = (uchar *)operator_new__((long)(int)(iVar13 * uVar1));
        (this->super_Fl_RGB_Image).array = puVar8;
        (this->super_Fl_RGB_Image).alloc_array = 1;
        uVar11 = 0xffffffffffffffff;
        if (-1 < (int)uVar1) {
          uVar11 = (long)(int)uVar1 << 3;
        }
        uVar15 = 0;
        if (0 < (int)uVar1) {
          uVar15 = uVar1;
        }
        pvVar9 = operator_new__(uVar11);
        puVar2 = local_58;
        uVar10 = 0;
        uVar11 = uVar10;
        for (; uVar15 != uVar10; uVar10 = uVar10 + 1) {
          *(uchar **)((long)pvVar9 + uVar10 * 8) = puVar8 + (int)uVar11;
          uVar11 = (ulong)(uint)((int)uVar11 + iVar13);
        }
        for (iVar6 = png_set_interlace_handling(pp); 0 < iVar6; iVar6 = iVar6 + -1) {
          png_read_rows(pp,pvVar9,0,(this->super_Fl_RGB_Image).super_Fl_Image.h_);
        }
        operator_delete__(pvVar9);
        png_read_end(pp,local_70);
        png_destroy_read_struct(&pp,&local_70,0);
        pcVar14 = local_60;
        if (puVar2 == (uchar *)0x0) {
          fclose(local_68);
          return;
        }
        if ((this->super_Fl_RGB_Image).super_Fl_Image.w_ == 0) {
          return;
        }
        if (local_60 == (char *)0x0) {
          return;
        }
        if ((this->super_Fl_RGB_Image).super_Fl_Image.h_ == 0) {
          return;
        }
        this_00 = (Fl_Shared_Image *)operator_new(0x48);
        Fl_Shared_Image::Fl_Shared_Image(this_00,pcVar14,(Fl_Image *)this);
        Fl_Shared_Image::add(this_00);
        return;
      }
      png_destroy_read_struct(&pp,&local_70,0);
      if (buffer_png == (uchar *)0x0) {
        fclose(__stream);
      }
      pcVar12 = "PNG file or data \"%s\" is too large or contains errors!\n";
      goto LAB_002062f6;
    }
    if (pp != (png_structp)0x0) {
      png_destroy_read_struct(&pp,0);
    }
  }
  if (buffer_png == (uchar *)0x0) {
    fclose(__stream);
  }
  pcVar12 = "Cannot allocate memory to read PNG file or data \"%s\".\n";
LAB_002062f6:
  (*Fl::warning)(pcVar12,pcVar14);
  (this->super_Fl_RGB_Image).super_Fl_Image.w_ = 0;
  (this->super_Fl_RGB_Image).super_Fl_Image.h_ = 0;
  (this->super_Fl_RGB_Image).super_Fl_Image.d_ = 0;
  (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -3;
  return;
}

Assistant:

void Fl_PNG_Image::load_png_(const char *name_png, const unsigned char *buffer_png, int maxsize)
{
#if defined(HAVE_LIBPNG) && defined(HAVE_LIBZ)
  int i;	  // Looping var
  FILE *fp = NULL;	  // File pointer
  int channels;	  // Number of color channels
  png_structp pp; // PNG read pointer
  png_infop info = 0; // PNG info pointers
  png_bytep *rows;// PNG row pointers
  fl_png_memory png_mem_data;
  int from_memory = (buffer_png != NULL); // true if reading image from memory

  if (!from_memory) {
    if ((fp = fl_fopen(name_png, "rb")) == NULL) {
      ld(ERR_FILE_ACCESS);
      return;
    }
  }
  const char *display_name = (name_png ? name_png : "In-memory PNG data");

  // Setup the PNG data structures...
  pp = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
  if (pp) info = png_create_info_struct(pp);
  if (!pp || !info) {
    if (pp) png_destroy_read_struct(&pp, NULL, NULL);
    if (!from_memory) fclose(fp);
    Fl::warning("Cannot allocate memory to read PNG file or data \"%s\".\n", display_name);
    w(0); h(0); d(0); ld(ERR_FORMAT);
    return;
  }
  
  if (setjmp(png_jmpbuf(pp)))
  {
    png_destroy_read_struct(&pp, &info, NULL);
    if (!from_memory) fclose(fp);
    Fl::warning("PNG file or data \"%s\" is too large or contains errors!\n", display_name);
    w(0); h(0); d(0); ld(ERR_FORMAT);
    return;
  }

  if (from_memory) {
    png_mem_data.current = buffer_png;
    png_mem_data.last = buffer_png + maxsize;
    png_mem_data.pp = pp;
    // Initialize the function pointer to the PNG read "engine"...
    png_set_read_fn (pp, (png_voidp) &png_mem_data, png_read_data_from_mem);
  } else {
    png_init_io(pp, fp); // Initialize the PNG file read "engine"...
  }  

  // Get the image dimensions and convert to grayscale or RGB...
  png_read_info(pp, info);

  if (png_get_color_type(pp, info) == PNG_COLOR_TYPE_PALETTE)
    png_set_expand(pp);

  if (png_get_color_type(pp, info) & PNG_COLOR_MASK_COLOR)
    channels = 3;
  else
    channels = 1;

  int num_trans = 0;
  png_get_tRNS(pp, info, 0, &num_trans, 0);
  if ((png_get_color_type(pp, info) & PNG_COLOR_MASK_ALPHA) || (num_trans != 0))
    channels ++;

  w((int)(png_get_image_width(pp, info)));
  h((int)(png_get_image_height(pp, info)));
  d(channels);

  if (png_get_bit_depth(pp, info) < 8)
  {
    png_set_packing(pp);
    png_set_expand(pp);
  }
  else if (png_get_bit_depth(pp, info) == 16)
    png_set_strip_16(pp);

#  if defined(HAVE_PNG_GET_VALID) && defined(HAVE_PNG_SET_TRNS_TO_ALPHA)
  // Handle transparency...
  if (png_get_valid(pp, info, PNG_INFO_tRNS))
    png_set_tRNS_to_alpha(pp);
#  endif // HAVE_PNG_GET_VALID && HAVE_PNG_SET_TRNS_TO_ALPHA

  if (((size_t)w()) * h() * d() > max_size() ) longjmp(png_jmpbuf(pp), 1);
  array = new uchar[w() * h() * d()];
  alloc_array = 1;

  // Allocate pointers...
  rows = new png_bytep[h()];

  for (i = 0; i < h(); i ++)
    rows[i] = (png_bytep)(array + i * w() * d());

  // Read the image, handling interlacing as needed...
  for (i = png_set_interlace_handling(pp); i > 0; i --)
    png_read_rows(pp, rows, NULL, h());

#ifdef WIN32
  // Some Windows graphics drivers don't honor transparency when RGB == white
  if (channels == 4) {
    // Convert RGB to 0 when alpha == 0...
    uchar *ptr = (uchar *)array;
    for (i = w() * h(); i > 0; i --, ptr += 4)
      if (!ptr[3]) ptr[0] = ptr[1] = ptr[2] = 0;
  }
#endif // WIN32

  // Free memory and return...
  delete[] rows;

  png_read_end(pp, info);
  png_destroy_read_struct(&pp, &info, NULL);

  if (from_memory) {
    if (w() && h() && name_png) {
      Fl_Shared_Image *si = new Fl_Shared_Image(name_png, this);
      si->add();
    }
  } else {
    fclose(fp);
  }
#endif // HAVE_LIBPNG && HAVE_LIBZ
}